

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint32_t helper_ceb(CPUS390XState_conflict *env,uint64_t f1,uint64_t f2)

{
  int iVar1;
  CPUS390XState_conflict *__mptr;
  uintptr_t unaff_retaddr;
  
  iVar1 = float32_compare_quiet_s390x((float32)f1,(float32)f2,&env->fpu_status);
  handle_exceptions(env,false,unaff_retaddr);
  if (iVar1 + 1U < 4) {
    return *(uint32_t *)(&DAT_00dc81b0 + (ulong)(iVar1 + 1U) * 4);
  }
  cpu_abort_s390x((CPUState *)(env[-0x1e].vregs + 0xf),"unknown return value for float compare\n");
}

Assistant:

uint32_t HELPER(ceb)(CPUS390XState *env, uint64_t f1, uint64_t f2)
{
    int cmp = float32_compare_quiet(f1, f2, &env->fpu_status);
    handle_exceptions(env, false, GETPC());
    return float_comp_to_cc(env, cmp);
}